

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,int *x,int ncat,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator,
                 vector<double,_std::allocator<double>_> *w)

{
  reference pvVar1;
  long in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  int in_R8D;
  vector<double,_std::allocator<double>_> *this;
  int *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  Xoshiro256PP *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  size_t row;
  double w_this;
  vector<double,_std::allocator<double>_> buffer_cnt;
  allocator_type *in_stack_ffffffffffffff58;
  value_type_conflict *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  value_type vVar2;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  double *local_78;
  vector<double,_std::allocator<double>_> local_48;
  int local_24;
  long local_20;
  double *buffer_prob_00;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  std::allocator<double>::allocator((allocator<double> *)0x1fdb7d);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  local_78 = in_RSI;
  std::allocator<double>::~allocator((allocator<double> *)0x1fdba2);
  buffer_prob_00 = local_78;
  for (; local_78 <= in_RDX; local_78 = (double *)((long)local_78 + 1)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_stack_00000020,
                        *(size_type *)(in_RDI + (long)local_78 * 8));
    vVar2 = *pvVar1;
    if (*(int *)(local_20 + *(long *)(in_RDI + (long)local_78 * 8) * 4) < 0) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(long)local_24);
      *pvVar1 = vVar2 + *pvVar1;
    }
    else {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_48,
                          (long)*(int *)(local_20 + *(long *)(in_RDI + (long)local_78 * 8) * 4));
      *pvVar1 = vVar2 + *pvVar1;
    }
  }
  this = (vector<double,_std::allocator<double>_> *)
         calc_kurtosis_weighted_internal<std::vector<double,std::allocator<double>>,double>
                   (in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),buffer_prob_00,
                    (MissingAction)((ulong)in_RDX >> 0x20),(CategSplit)in_RDX,in_stack_00000020,
                    in_stack_00000028);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return (double)this;
}

Assistant:

double calc_kurtosis_weighted(size_t ix_arr[], size_t st, size_t end, int x[], int ncat, double buffer_prob[],
                              MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator,
                              mapping &restrict w)
{
    std::vector<ldouble_safe> buffer_cnt(ncat+1, 0.);
    ldouble_safe w_this;

    for (size_t row = st; row <= end; row++)
    {
        w_this = w[ix_arr[row]];
        if (likely(x[ix_arr[row]] >= 0))
            buffer_cnt[x[ix_arr[row]]] += w_this;
        else
            buffer_cnt[ncat] += w_this;
    }
    
    return calc_kurtosis_weighted_internal<mapping, ldouble_safe>(
                                           buffer_cnt, x, ncat,
                                           buffer_prob, missing_action, cat_split_type,
                                           rnd_generator, w);
}